

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O1

int __thiscall AbstractModuleClient::processTimer(AbstractModuleClient *this,int timer_id)

{
  int iVar1;
  void *pvVar2;
  size_t eventsize;
  int event;
  undefined8 local_20;
  undefined1 local_14 [4];
  
  local_20 = 4;
  if (this->timestampsub != (zsock_t *)0x0) {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->tsmutex);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
      __cxa_begin_catch();
      std::terminate();
    }
    pvVar2 = zsock_resolve(this->timestampsub);
    zmq_getsockopt(pvVar2,0xf,local_14,&local_20);
    pthread_mutex_unlock((pthread_mutex_t *)&this->tsmutex);
  }
  return 0;
}

Assistant:

int AbstractModuleClient::processTimer(int timer_id){
    int event;
    size_t eventsize = sizeof(event);
    if(timestampsub){
        tsmutex.lock();
        zmq_getsockopt (zsock_resolve(timestampsub), ZMQ_EVENTS, &event, &eventsize);
        tsmutex.unlock();
    }
    return 0;
}